

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::Symbol::
visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
          (Symbol *this,TypePrinter *visitor,basic_string_view<char,_std::char_traits<char>_> *args)

{
  string_view sVar1;
  string_view sVar2;
  string_view overrideName;
  string_view sVar3;
  string_view sVar4;
  string_view sVar5;
  string_view sVar6;
  string_view sVar7;
  string_view sVar8;
  string_view sVar9;
  string_view sVar10;
  string_view sVar11;
  string_view sVar12;
  string_view sVar13;
  string_view sVar14;
  string_view sVar15;
  string_view sVar16;
  string_view sVar17;
  string_view sVar18;
  string_view sVar19;
  string_view sVar20;
  string_view sVar21;
  string_view sVar22;
  string_view sVar23;
  string_view sVar24;
  string_view sVar25;
  string_view sVar26;
  string_view sVar27;
  string_view sVar28;
  string_view sVar29;
  string_view sVar30;
  string_view sVar31;
  string_view sVar32;
  string_view sVar33;
  string_view sVar34;
  string_view sVar35;
  string_view sVar36;
  string_view sVar37;
  string_view sVar38;
  string_view sVar39;
  string_view sVar40;
  string_view sVar41;
  string_view sVar42;
  string_view sVar43;
  string_view sVar44;
  string_view sVar45;
  string_view sVar46;
  string_view sVar47;
  string_view sVar48;
  string_view sVar49;
  string_view sVar50;
  string_view sVar51;
  string_view sVar52;
  string_view sVar53;
  string_view sVar54;
  string_view sVar55;
  string_view sVar56;
  string_view sVar57;
  string_view sVar58;
  string_view sVar59;
  string_view sVar60;
  string_view sVar61;
  string_view sVar62;
  string_view sVar63;
  string_view sVar64;
  string_view overrideName_00;
  string_view sVar65;
  string_view sVar66;
  string_view sVar67;
  string_view sVar68;
  string_view sVar69;
  string_view overrideName_01;
  string_view overrideName_02;
  string_view overrideName_03;
  string_view overrideName_04;
  string_view sVar70;
  string_view sVar71;
  string_view sVar72;
  string_view sVar73;
  string_view sVar74;
  string_view sVar75;
  string_view sVar76;
  string_view sVar77;
  string_view sVar78;
  string_view sVar79;
  string_view sVar80;
  string_view sVar81;
  string_view sVar82;
  string_view sVar83;
  string_view sVar84;
  logic_error *this_00;
  string local_698;
  allocator<char> local_661;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  size_t local_5c0;
  char *local_5b8;
  size_t local_5b0;
  char *local_5a8;
  size_t local_5a0;
  char *local_598;
  size_t local_590;
  char *local_588;
  size_t local_580;
  char *local_578;
  size_t local_570;
  char *local_568;
  size_t local_560;
  char *local_558;
  size_t local_550;
  char *local_548;
  size_t local_540;
  char *local_538;
  size_t local_530;
  char *local_528;
  size_t local_520;
  char *local_518;
  size_t local_510;
  char *local_508;
  size_t local_500;
  char *local_4f8;
  size_t local_4f0;
  char *local_4e8;
  size_t local_4e0;
  char *local_4d8;
  size_t local_4d0;
  char *local_4c8;
  size_t local_4c0;
  char *local_4b8;
  size_t local_4b0;
  char *local_4a8;
  size_t local_4a0;
  char *local_498;
  size_t local_490;
  char *local_488;
  size_t local_480;
  char *local_478;
  size_t local_470;
  char *local_468;
  size_t local_460;
  char *local_458;
  size_t local_450;
  char *local_448;
  size_t local_440;
  char *local_438;
  size_t local_430;
  char *local_428;
  size_t local_420;
  char *local_418;
  size_t local_410;
  char *local_408;
  size_t local_400;
  char *local_3f8;
  size_t local_3f0;
  char *local_3e8;
  size_t local_3e0;
  char *local_3d8;
  size_t local_3d0;
  char *local_3c8;
  size_t local_3c0;
  char *local_3b8;
  size_t local_3b0;
  char *local_3a8;
  size_t local_3a0;
  char *local_398;
  size_t local_390;
  char *local_388;
  size_t local_380;
  char *local_378;
  size_t local_370;
  char *local_368;
  size_t local_360;
  char *local_358;
  size_t local_350;
  char *local_348;
  size_t local_340;
  char *local_338;
  size_t local_330;
  char *local_328;
  size_t local_320;
  char *local_318;
  size_t local_310;
  char *local_308;
  size_t local_300;
  char *local_2f8;
  size_t local_2f0;
  char *local_2e8;
  size_t local_2e0;
  char *local_2d8;
  size_t local_2d0;
  char *local_2c8;
  size_t local_2c0;
  char *local_2b8;
  size_t local_2b0;
  char *local_2a8;
  size_t local_2a0;
  char *local_298;
  size_t local_290;
  char *local_288;
  size_t local_280;
  char *local_278;
  size_t local_270;
  char *local_268;
  size_t local_260;
  char *local_258;
  size_t local_250;
  char *local_248;
  size_t local_240;
  char *local_238;
  size_t local_230;
  char *local_228;
  size_t local_220;
  char *local_218;
  size_t local_210;
  char *local_208;
  size_t local_200;
  char *local_1f8;
  size_t local_1f0;
  char *local_1e8;
  size_t local_1e0;
  char *local_1d8;
  size_t local_1d0;
  char *local_1c8;
  size_t local_1c0;
  char *local_1b8;
  size_t local_1b0;
  char *local_1a8;
  size_t local_1a0;
  char *local_198;
  size_t local_190;
  char *local_188;
  size_t local_180;
  char *local_178;
  size_t local_170;
  char *local_168;
  size_t local_160;
  char *local_158;
  size_t local_150;
  char *local_148;
  size_t local_140;
  char *local_138;
  size_t local_130;
  char *local_128;
  size_t local_120;
  char *local_118;
  size_t local_110;
  char *local_108;
  size_t local_100;
  char *local_f8;
  size_t local_f0;
  char *local_e8;
  size_t local_e0;
  char *local_d8;
  size_t local_d0;
  char *local_c8;
  size_t local_c0;
  char *local_b8;
  size_t local_b0;
  char *local_a8;
  size_t local_a0;
  char *local_98;
  size_t local_90;
  char *local_88;
  size_t local_80;
  char *local_78;
  size_t local_70;
  char *local_68;
  size_t local_60;
  char *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  size_t local_30;
  char *local_28;
  basic_string_view<char,_std::char_traits<char>_> *local_20;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  TypePrinter *visitor_local;
  Symbol *this_local;
  
  local_20 = args;
  args_local = (basic_string_view<char,_std::char_traits<char>_> *)visitor;
  visitor_local = (TypePrinter *)this;
  switch(this->kind) {
  case Unknown:
    local_30 = args->_M_len;
    local_28 = args->_M_str;
    sVar1._M_len = args->_M_len;
    sVar1._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::Symbol>(visitor,this,sVar1);
    break;
  case Root:
    local_60 = args->_M_len;
    local_58 = args->_M_str;
    sVar3._M_len = args->_M_len;
    sVar3._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::RootSymbol>(visitor,(RootSymbol *)this,sVar3);
    break;
  case CompilationUnit:
    local_70 = args->_M_len;
    local_68 = args->_M_str;
    sVar4._M_len = args->_M_len;
    sVar4._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::CompilationUnitSymbol>
              (visitor,(CompilationUnitSymbol *)this,sVar4);
    break;
  case DeferredMember:
    local_40 = args->_M_len;
    local_38 = args->_M_str;
    sVar2._M_len = args->_M_len;
    sVar2._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::Symbol>(visitor,this,sVar2);
    break;
  case TransparentMember:
    local_90 = args->_M_len;
    local_88 = args->_M_str;
    sVar6._M_len = args->_M_len;
    sVar6._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::TransparentMemberSymbol>
              (visitor,(TransparentMemberSymbol *)this,sVar6);
    break;
  case EmptyMember:
    local_a0 = args->_M_len;
    local_98 = args->_M_str;
    sVar7._M_len = args->_M_len;
    sVar7._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::EmptyMemberSymbol>(visitor,(EmptyMemberSymbol *)this,sVar7);
    break;
  case PredefinedIntegerType:
    local_410 = args->_M_len;
    local_408 = args->_M_str;
    sVar62._M_len = args->_M_len;
    sVar62._M_str = args->_M_str;
    TypePrinter::visit(visitor,(PredefinedIntegerType *)this,sVar62);
    break;
  case ScalarType:
    local_420 = args->_M_len;
    local_418 = args->_M_str;
    sVar63._M_len = args->_M_len;
    sVar63._M_str = args->_M_str;
    TypePrinter::visit(visitor,(ScalarType *)this,sVar63);
    break;
  case FloatingType:
    local_430 = args->_M_len;
    local_428 = args->_M_str;
    sVar64._M_len = args->_M_len;
    sVar64._M_str = args->_M_str;
    TypePrinter::visit(visitor,(FloatingType *)this,sVar64);
    break;
  case EnumType:
    local_440 = args->_M_len;
    local_438 = args->_M_str;
    overrideName_00._M_len = args->_M_len;
    overrideName_00._M_str = args->_M_str;
    TypePrinter::visit(visitor,(EnumType *)this,overrideName_00);
    break;
  case EnumValue:
    local_b0 = args->_M_len;
    local_a8 = args->_M_str;
    sVar8._M_len = args->_M_len;
    sVar8._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::EnumValueSymbol>(visitor,(EnumValueSymbol *)this,sVar8);
    break;
  case PackedArrayType:
    local_450 = args->_M_len;
    local_448 = args->_M_str;
    sVar65._M_len = args->_M_len;
    sVar65._M_str = args->_M_str;
    TypePrinter::visit(visitor,(PackedArrayType *)this,sVar65);
    break;
  case FixedSizeUnpackedArrayType:
    local_460 = args->_M_len;
    local_458 = args->_M_str;
    sVar66._M_len = args->_M_len;
    sVar66._M_str = args->_M_str;
    TypePrinter::visit(visitor,(FixedSizeUnpackedArrayType *)this,sVar66);
    break;
  case DynamicArrayType:
    local_470 = args->_M_len;
    local_468 = args->_M_str;
    sVar67._M_len = args->_M_len;
    sVar67._M_str = args->_M_str;
    TypePrinter::visit(visitor,(DynamicArrayType *)this,sVar67);
    break;
  case AssociativeArrayType:
    local_480 = args->_M_len;
    local_478 = args->_M_str;
    sVar68._M_len = args->_M_len;
    sVar68._M_str = args->_M_str;
    TypePrinter::visit(visitor,(AssociativeArrayType *)this,sVar68);
    break;
  case QueueType:
    local_490 = args->_M_len;
    local_488 = args->_M_str;
    sVar69._M_len = args->_M_len;
    sVar69._M_str = args->_M_str;
    TypePrinter::visit(visitor,(QueueType *)this,sVar69);
    break;
  case PackedStructType:
    local_4a0 = args->_M_len;
    local_498 = args->_M_str;
    overrideName_01._M_len = args->_M_len;
    overrideName_01._M_str = args->_M_str;
    TypePrinter::visit(visitor,(PackedStructType *)this,overrideName_01);
    break;
  case UnpackedStructType:
    local_4b0 = args->_M_len;
    local_4a8 = args->_M_str;
    overrideName_02._M_len = args->_M_len;
    overrideName_02._M_str = args->_M_str;
    TypePrinter::visit(visitor,(UnpackedStructType *)this,overrideName_02);
    break;
  case PackedUnionType:
    local_4c0 = args->_M_len;
    local_4b8 = args->_M_str;
    overrideName_03._M_len = args->_M_len;
    overrideName_03._M_str = args->_M_str;
    TypePrinter::visit(visitor,(PackedUnionType *)this,overrideName_03);
    break;
  case UnpackedUnionType:
    local_4d0 = args->_M_len;
    local_4c8 = args->_M_str;
    overrideName_04._M_len = args->_M_len;
    overrideName_04._M_str = args->_M_str;
    TypePrinter::visit(visitor,(UnpackedUnionType *)this,overrideName_04);
    break;
  case ClassType:
    local_4e0 = args->_M_len;
    local_4d8 = args->_M_str;
    sVar70._M_len = args->_M_len;
    sVar70._M_str = args->_M_str;
    TypePrinter::visit(visitor,(ClassType *)this,sVar70);
    break;
  case CovergroupType:
    local_4f0 = args->_M_len;
    local_4e8 = args->_M_str;
    sVar71._M_len = args->_M_len;
    sVar71._M_str = args->_M_str;
    TypePrinter::visit(visitor,(CovergroupType *)this,sVar71);
    break;
  case VoidType:
    local_500 = args->_M_len;
    local_4f8 = args->_M_str;
    sVar72._M_len = args->_M_len;
    sVar72._M_str = args->_M_str;
    TypePrinter::visit(visitor,(VoidType *)this,sVar72);
    break;
  case NullType:
    local_510 = args->_M_len;
    local_508 = args->_M_str;
    sVar73._M_len = args->_M_len;
    sVar73._M_str = args->_M_str;
    TypePrinter::visit(visitor,(NullType *)this,sVar73);
    break;
  case CHandleType:
    local_520 = args->_M_len;
    local_518 = args->_M_str;
    sVar74._M_len = args->_M_len;
    sVar74._M_str = args->_M_str;
    TypePrinter::visit(visitor,(CHandleType *)this,sVar74);
    break;
  case StringType:
    local_530 = args->_M_len;
    local_528 = args->_M_str;
    sVar75._M_len = args->_M_len;
    sVar75._M_str = args->_M_str;
    TypePrinter::visit(visitor,(StringType *)this,sVar75);
    break;
  case EventType:
    local_540 = args->_M_len;
    local_538 = args->_M_str;
    sVar76._M_len = args->_M_len;
    sVar76._M_str = args->_M_str;
    TypePrinter::visit(visitor,(EventType *)this,sVar76);
    break;
  case UnboundedType:
    local_550 = args->_M_len;
    local_548 = args->_M_str;
    sVar77._M_len = args->_M_len;
    sVar77._M_str = args->_M_str;
    TypePrinter::visit(visitor,(UnboundedType *)this,sVar77);
    break;
  case TypeRefType:
    local_560 = args->_M_len;
    local_558 = args->_M_str;
    sVar78._M_len = args->_M_len;
    sVar78._M_str = args->_M_str;
    TypePrinter::visit(visitor,(TypeRefType *)this,sVar78);
    break;
  case UntypedType:
    local_570 = args->_M_len;
    local_568 = args->_M_str;
    sVar79._M_len = args->_M_len;
    sVar79._M_str = args->_M_str;
    TypePrinter::visit(visitor,(UntypedType *)this,sVar79);
    break;
  case SequenceType:
    local_580 = args->_M_len;
    local_578 = args->_M_str;
    sVar80._M_len = args->_M_len;
    sVar80._M_str = args->_M_str;
    TypePrinter::visit(visitor,(SequenceType *)this,sVar80);
    break;
  case PropertyType:
    local_590 = args->_M_len;
    local_588 = args->_M_str;
    sVar81._M_len = args->_M_len;
    sVar81._M_str = args->_M_str;
    TypePrinter::visit(visitor,(PropertyType *)this,sVar81);
    break;
  case VirtualInterfaceType:
    local_5a0 = args->_M_len;
    local_598 = args->_M_str;
    sVar82._M_len = args->_M_len;
    sVar82._M_str = args->_M_str;
    TypePrinter::visit(visitor,(VirtualInterfaceType *)this,sVar82);
    break;
  case TypeAlias:
    local_50 = args->_M_len;
    local_48 = args->_M_str;
    overrideName._M_len = args->_M_len;
    overrideName._M_str = args->_M_str;
    TypePrinter::visit(visitor,(TypeAliasType *)this,overrideName);
    break;
  case ErrorType:
    local_5b0 = args->_M_len;
    local_5a8 = args->_M_str;
    sVar83._M_len = args->_M_len;
    sVar83._M_str = args->_M_str;
    TypePrinter::visit(visitor,(ErrorType *)this,sVar83);
    break;
  case ForwardingTypedef:
    local_c0 = args->_M_len;
    local_b8 = args->_M_str;
    sVar9._M_len = args->_M_len;
    sVar9._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::ForwardingTypedefSymbol>
              (visitor,(ForwardingTypedefSymbol *)this,sVar9);
    break;
  case NetType:
    local_5c0 = args->_M_len;
    local_5b8 = args->_M_str;
    sVar84._M_len = args->_M_len;
    sVar84._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::NetType>(visitor,(NetType *)this,sVar84);
    break;
  case Parameter:
    local_d0 = args->_M_len;
    local_c8 = args->_M_str;
    sVar10._M_len = args->_M_len;
    sVar10._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::ParameterSymbol>(visitor,(ParameterSymbol *)this,sVar10);
    break;
  case TypeParameter:
    local_e0 = args->_M_len;
    local_d8 = args->_M_str;
    sVar11._M_len = args->_M_len;
    sVar11._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::TypeParameterSymbol>(visitor,(TypeParameterSymbol *)this,sVar11);
    break;
  case Port:
    local_f0 = args->_M_len;
    local_e8 = args->_M_str;
    sVar12._M_len = args->_M_len;
    sVar12._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::PortSymbol>(visitor,(PortSymbol *)this,sVar12);
    break;
  case MultiPort:
    local_100 = args->_M_len;
    local_f8 = args->_M_str;
    sVar13._M_len = args->_M_len;
    sVar13._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::MultiPortSymbol>(visitor,(MultiPortSymbol *)this,sVar13);
    break;
  case InterfacePort:
    local_110 = args->_M_len;
    local_108 = args->_M_str;
    sVar14._M_len = args->_M_len;
    sVar14._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::InterfacePortSymbol>(visitor,(InterfacePortSymbol *)this,sVar14);
    break;
  case Modport:
    local_220 = args->_M_len;
    local_218 = args->_M_str;
    sVar31._M_len = args->_M_len;
    sVar31._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::ModportSymbol>(visitor,(ModportSymbol *)this,sVar31);
    break;
  case ModportPort:
    local_230 = args->_M_len;
    local_228 = args->_M_str;
    sVar32._M_len = args->_M_len;
    sVar32._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::ModportPortSymbol>(visitor,(ModportPortSymbol *)this,sVar32);
    break;
  case ModportClocking:
    local_240 = args->_M_len;
    local_238 = args->_M_str;
    sVar33._M_len = args->_M_len;
    sVar33._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::ModportClockingSymbol>
              (visitor,(ModportClockingSymbol *)this,sVar33);
    break;
  case Instance:
    local_120 = args->_M_len;
    local_118 = args->_M_str;
    sVar15._M_len = args->_M_len;
    sVar15._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::InstanceSymbol>(visitor,(InstanceSymbol *)this,sVar15);
    break;
  case InstanceBody:
    local_130 = args->_M_len;
    local_128 = args->_M_str;
    sVar16._M_len = args->_M_len;
    sVar16._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::InstanceBodySymbol>(visitor,(InstanceBodySymbol *)this,sVar16);
    break;
  case InstanceArray:
    local_140 = args->_M_len;
    local_138 = args->_M_str;
    sVar17._M_len = args->_M_len;
    sVar17._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::InstanceArraySymbol>(visitor,(InstanceArraySymbol *)this,sVar17);
    break;
  case Package:
    local_150 = args->_M_len;
    local_148 = args->_M_str;
    sVar18._M_len = args->_M_len;
    sVar18._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::PackageSymbol>(visitor,(PackageSymbol *)this,sVar18);
    break;
  case ExplicitImport:
    local_160 = args->_M_len;
    local_158 = args->_M_str;
    sVar19._M_len = args->_M_len;
    sVar19._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::ExplicitImportSymbol>
              (visitor,(ExplicitImportSymbol *)this,sVar19);
    break;
  case WildcardImport:
    local_170 = args->_M_len;
    local_168 = args->_M_str;
    sVar20._M_len = args->_M_len;
    sVar20._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::WildcardImportSymbol>
              (visitor,(WildcardImportSymbol *)this,sVar20);
    break;
  case Attribute:
    local_80 = args->_M_len;
    local_78 = args->_M_str;
    sVar5._M_len = args->_M_len;
    sVar5._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::AttributeSymbol>(visitor,(AttributeSymbol *)this,sVar5);
    break;
  case Genvar:
    local_260 = args->_M_len;
    local_258 = args->_M_str;
    sVar35._M_len = args->_M_len;
    sVar35._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::GenvarSymbol>(visitor,(GenvarSymbol *)this,sVar35);
    break;
  case GenerateBlock:
    local_180 = args->_M_len;
    local_178 = args->_M_str;
    sVar21._M_len = args->_M_len;
    sVar21._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::GenerateBlockSymbol>(visitor,(GenerateBlockSymbol *)this,sVar21);
    break;
  case GenerateBlockArray:
    local_190 = args->_M_len;
    local_188 = args->_M_str;
    sVar22._M_len = args->_M_len;
    sVar22._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::GenerateBlockArraySymbol>
              (visitor,(GenerateBlockArraySymbol *)this,sVar22);
    break;
  case ProceduralBlock:
    local_1a0 = args->_M_len;
    local_198 = args->_M_str;
    sVar23._M_len = args->_M_len;
    sVar23._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::ProceduralBlockSymbol>
              (visitor,(ProceduralBlockSymbol *)this,sVar23);
    break;
  case StatementBlock:
    local_1b0 = args->_M_len;
    local_1a8 = args->_M_str;
    sVar24._M_len = args->_M_len;
    sVar24._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::StatementBlockSymbol>
              (visitor,(StatementBlockSymbol *)this,sVar24);
    break;
  case Net:
    local_1c0 = args->_M_len;
    local_1b8 = args->_M_str;
    sVar25._M_len = args->_M_len;
    sVar25._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::NetSymbol>(visitor,(NetSymbol *)this,sVar25);
    break;
  case Variable:
    local_1d0 = args->_M_len;
    local_1c8 = args->_M_str;
    sVar26._M_len = args->_M_len;
    sVar26._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::VariableSymbol>(visitor,(VariableSymbol *)this,sVar26);
    break;
  case FormalArgument:
    local_1e0 = args->_M_len;
    local_1d8 = args->_M_str;
    sVar27._M_len = args->_M_len;
    sVar27._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::FormalArgumentSymbol>
              (visitor,(FormalArgumentSymbol *)this,sVar27);
    break;
  case Field:
    local_1f0 = args->_M_len;
    local_1e8 = args->_M_str;
    sVar28._M_len = args->_M_len;
    sVar28._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::FieldSymbol>(visitor,(FieldSymbol *)this,sVar28);
    break;
  case ClassProperty:
    local_200 = args->_M_len;
    local_1f8 = args->_M_str;
    sVar29._M_len = args->_M_len;
    sVar29._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::ClassPropertySymbol>(visitor,(ClassPropertySymbol *)this,sVar29);
    break;
  case Subroutine:
    local_210 = args->_M_len;
    local_208 = args->_M_str;
    sVar30._M_len = args->_M_len;
    sVar30._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::SubroutineSymbol>(visitor,(SubroutineSymbol *)this,sVar30);
    break;
  case ContinuousAssign:
    local_250 = args->_M_len;
    local_248 = args->_M_str;
    sVar34._M_len = args->_M_len;
    sVar34._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::ContinuousAssignSymbol>
              (visitor,(ContinuousAssignSymbol *)this,sVar34);
    break;
  case ElabSystemTask:
    local_270 = args->_M_len;
    local_268 = args->_M_str;
    sVar36._M_len = args->_M_len;
    sVar36._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::ElabSystemTaskSymbol>
              (visitor,(ElabSystemTaskSymbol *)this,sVar36);
    break;
  case GenericClassDef:
    local_280 = args->_M_len;
    local_278 = args->_M_str;
    sVar37._M_len = args->_M_len;
    sVar37._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::GenericClassDefSymbol>
              (visitor,(GenericClassDefSymbol *)this,sVar37);
    break;
  case MethodPrototype:
    local_290 = args->_M_len;
    local_288 = args->_M_str;
    sVar38._M_len = args->_M_len;
    sVar38._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::MethodPrototypeSymbol>
              (visitor,(MethodPrototypeSymbol *)this,sVar38);
    break;
  case UnknownModule:
    local_2a0 = args->_M_len;
    local_298 = args->_M_str;
    sVar39._M_len = args->_M_len;
    sVar39._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::UnknownModuleSymbol>(visitor,(UnknownModuleSymbol *)this,sVar39);
    break;
  case Iterator:
    local_2b0 = args->_M_len;
    local_2a8 = args->_M_str;
    sVar40._M_len = args->_M_len;
    sVar40._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::IteratorSymbol>(visitor,(IteratorSymbol *)this,sVar40);
    break;
  case PatternVar:
    local_2c0 = args->_M_len;
    local_2b8 = args->_M_str;
    sVar41._M_len = args->_M_len;
    sVar41._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::PatternVarSymbol>(visitor,(PatternVarSymbol *)this,sVar41);
    break;
  case ConstraintBlock:
    local_2d0 = args->_M_len;
    local_2c8 = args->_M_str;
    sVar42._M_len = args->_M_len;
    sVar42._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::ConstraintBlockSymbol>
              (visitor,(ConstraintBlockSymbol *)this,sVar42);
    break;
  case DefParam:
    local_2e0 = args->_M_len;
    local_2d8 = args->_M_str;
    sVar43._M_len = args->_M_len;
    sVar43._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::DefParamSymbol>(visitor,(DefParamSymbol *)this,sVar43);
    break;
  case Specparam:
    local_2f0 = args->_M_len;
    local_2e8 = args->_M_str;
    sVar44._M_len = args->_M_len;
    sVar44._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::SpecparamSymbol>(visitor,(SpecparamSymbol *)this,sVar44);
    break;
  case Primitive:
    local_300 = args->_M_len;
    local_2f8 = args->_M_str;
    sVar45._M_len = args->_M_len;
    sVar45._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::PrimitiveSymbol>(visitor,(PrimitiveSymbol *)this,sVar45);
    break;
  case PrimitivePort:
    local_310 = args->_M_len;
    local_308 = args->_M_str;
    sVar46._M_len = args->_M_len;
    sVar46._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::PrimitivePortSymbol>(visitor,(PrimitivePortSymbol *)this,sVar46);
    break;
  case PrimitiveInstance:
    local_320 = args->_M_len;
    local_318 = args->_M_str;
    sVar47._M_len = args->_M_len;
    sVar47._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::PrimitiveInstanceSymbol>
              (visitor,(PrimitiveInstanceSymbol *)this,sVar47);
    break;
  case SpecifyBlock:
    local_330 = args->_M_len;
    local_328 = args->_M_str;
    sVar48._M_len = args->_M_len;
    sVar48._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::SpecifyBlockSymbol>(visitor,(SpecifyBlockSymbol *)this,sVar48);
    break;
  case Sequence:
    local_340 = args->_M_len;
    local_338 = args->_M_str;
    sVar49._M_len = args->_M_len;
    sVar49._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::SequenceSymbol>(visitor,(SequenceSymbol *)this,sVar49);
    break;
  case Property:
    local_350 = args->_M_len;
    local_348 = args->_M_str;
    sVar50._M_len = args->_M_len;
    sVar50._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::PropertySymbol>(visitor,(PropertySymbol *)this,sVar50);
    break;
  case AssertionPort:
    local_360 = args->_M_len;
    local_358 = args->_M_str;
    sVar51._M_len = args->_M_len;
    sVar51._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::AssertionPortSymbol>(visitor,(AssertionPortSymbol *)this,sVar51);
    break;
  case ClockingBlock:
    local_370 = args->_M_len;
    local_368 = args->_M_str;
    sVar52._M_len = args->_M_len;
    sVar52._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::ClockingBlockSymbol>(visitor,(ClockingBlockSymbol *)this,sVar52);
    break;
  case ClockVar:
    local_380 = args->_M_len;
    local_378 = args->_M_str;
    sVar53._M_len = args->_M_len;
    sVar53._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::ClockVarSymbol>(visitor,(ClockVarSymbol *)this,sVar53);
    break;
  case LocalAssertionVar:
    local_390 = args->_M_len;
    local_388 = args->_M_str;
    sVar54._M_len = args->_M_len;
    sVar54._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::LocalAssertionVarSymbol>
              (visitor,(LocalAssertionVarSymbol *)this,sVar54);
    break;
  case LetDecl:
    local_3a0 = args->_M_len;
    local_398 = args->_M_str;
    sVar55._M_len = args->_M_len;
    sVar55._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::LetDeclSymbol>(visitor,(LetDeclSymbol *)this,sVar55);
    break;
  case RandSeqProduction:
    local_3b0 = args->_M_len;
    local_3a8 = args->_M_str;
    sVar56._M_len = args->_M_len;
    sVar56._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::RandSeqProductionSymbol>
              (visitor,(RandSeqProductionSymbol *)this,sVar56);
    break;
  case CovergroupBody:
    local_3c0 = args->_M_len;
    local_3b8 = args->_M_str;
    sVar57._M_len = args->_M_len;
    sVar57._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::CovergroupBodySymbol>
              (visitor,(CovergroupBodySymbol *)this,sVar57);
    break;
  case Coverpoint:
    local_3d0 = args->_M_len;
    local_3c8 = args->_M_str;
    sVar58._M_len = args->_M_len;
    sVar58._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::CoverpointSymbol>(visitor,(CoverpointSymbol *)this,sVar58);
    break;
  case CoverCross:
    local_3e0 = args->_M_len;
    local_3d8 = args->_M_str;
    sVar59._M_len = args->_M_len;
    sVar59._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::CoverCrossSymbol>(visitor,(CoverCrossSymbol *)this,sVar59);
    break;
  case CoverCrossBody:
    local_3f0 = args->_M_len;
    local_3e8 = args->_M_str;
    sVar60._M_len = args->_M_len;
    sVar60._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::CoverCrossBodySymbol>
              (visitor,(CoverCrossBodySymbol *)this,sVar60);
    break;
  case CoverageBin:
    local_400 = args->_M_len;
    local_3f8 = args->_M_str;
    sVar61._M_len = args->_M_len;
    sVar61._M_str = args->_M_str;
    TypePrinter::visit<slang::ast::CoverageBinSymbol>(visitor,(CoverageBinSymbol *)this,sVar61);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_660,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_661);
    std::operator+(&local_640,&local_660,":");
    std::__cxx11::to_string(&local_698,0xe4);
    std::operator+(&local_620,&local_640,&local_698);
    std::operator+(&local_600,&local_620,": ");
    std::operator+(&local_5e0,&local_600,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_5e0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

decltype(auto) Symbol::visit(TVisitor&& visitor, Args&&... args) const {
    // clang-format off
#define SYMBOL(k) case SymbolKind::k: return visitor.visit(*static_cast<const k##Symbol*>(this), std::forward<Args>(args)...)
#define TYPE(k) case SymbolKind::k: return visitor.visit(*static_cast<const k*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case SymbolKind::Unknown: return visitor.visit(*this, std::forward<Args>(args)...);
        case SymbolKind::DeferredMember: return visitor.visit(*this, std::forward<Args>(args)...);
        case SymbolKind::TypeAlias: return visitor.visit(*static_cast<const TypeAliasType*>(this), std::forward<Args>(args)...);
        SYMBOL(Root);
        SYMBOL(CompilationUnit);
        SYMBOL(Attribute);
        SYMBOL(TransparentMember);
        SYMBOL(EmptyMember);
        SYMBOL(EnumValue);
        SYMBOL(ForwardingTypedef);
        SYMBOL(Parameter);
        SYMBOL(TypeParameter);
        SYMBOL(Port);
        SYMBOL(MultiPort);
        SYMBOL(InterfacePort);
        SYMBOL(Instance);
        SYMBOL(InstanceBody);
        SYMBOL(InstanceArray);
        SYMBOL(Package);
        SYMBOL(ExplicitImport);
        SYMBOL(WildcardImport);
        SYMBOL(GenerateBlock);
        SYMBOL(GenerateBlockArray);
        SYMBOL(ProceduralBlock);
        SYMBOL(StatementBlock);
        SYMBOL(Net);
        SYMBOL(Variable);
        SYMBOL(FormalArgument);
        SYMBOL(Field);
        SYMBOL(ClassProperty);
        SYMBOL(Subroutine);
        SYMBOL(Modport);
        SYMBOL(ModportPort);
        SYMBOL(ModportClocking);
        SYMBOL(ContinuousAssign);
        SYMBOL(Genvar);
        SYMBOL(ElabSystemTask);
        SYMBOL(GenericClassDef);
        SYMBOL(MethodPrototype);
        SYMBOL(UnknownModule);
        SYMBOL(Iterator);
        SYMBOL(PatternVar);
        SYMBOL(ConstraintBlock);
        SYMBOL(DefParam);
        SYMBOL(Specparam);
        SYMBOL(Primitive);
        SYMBOL(PrimitivePort);
        SYMBOL(PrimitiveInstance);
        SYMBOL(SpecifyBlock);
        SYMBOL(Sequence);
        SYMBOL(Property);
        SYMBOL(AssertionPort);
        SYMBOL(ClockingBlock);
        SYMBOL(ClockVar);
        SYMBOL(LocalAssertionVar);
        SYMBOL(LetDecl);
        SYMBOL(RandSeqProduction);
        SYMBOL(CovergroupBody);
        SYMBOL(Coverpoint);
        SYMBOL(CoverCross);
        SYMBOL(CoverCrossBody);
        SYMBOL(CoverageBin);
        TYPE(PredefinedIntegerType);
        TYPE(ScalarType);
        TYPE(FloatingType);
        TYPE(EnumType);
        TYPE(PackedArrayType);
        TYPE(FixedSizeUnpackedArrayType);
        TYPE(DynamicArrayType);
        TYPE(AssociativeArrayType);
        TYPE(QueueType);
        TYPE(PackedStructType);
        TYPE(UnpackedStructType);
        TYPE(PackedUnionType);
        TYPE(UnpackedUnionType);
        TYPE(ClassType);
        TYPE(CovergroupType);
        TYPE(VoidType);
        TYPE(NullType);
        TYPE(CHandleType);
        TYPE(StringType);
        TYPE(EventType);
        TYPE(UnboundedType);
        TYPE(TypeRefType);
        TYPE(UntypedType);
        TYPE(SequenceType);
        TYPE(PropertyType);
        TYPE(VirtualInterfaceType);
        TYPE(ErrorType);
        TYPE(NetType);
    }
#undef TYPE
#undef SYMBOL
    // clang-format on
    ASSUME_UNREACHABLE;
}